

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void keyboardHandleModifiers
               (void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t modsDepressed,
               uint32_t modsLatched,uint32_t modsLocked,uint32_t group)

{
  int iVar1;
  size_t i;
  long lVar2;
  anon_struct_8_2_14e37ca0 modifiers [6];
  
  _glfw.wl.serial = serial;
  if (_glfw.wl.xkb.keymap != (xkb_keymap *)0x0) {
    (*_glfw.wl.xkb.state_update_mask)
              (_glfw.wl.xkb.state,modsDepressed,modsLatched,modsLocked,0,0,group);
    _glfw.wl.xkb.modifiers = 0;
    modifiers[0].index = _glfw.wl.xkb.controlIndex;
    modifiers[0].bit = 2;
    modifiers[1].index = _glfw.wl.xkb.altIndex;
    modifiers[1].bit = 4;
    modifiers[2].index = _glfw.wl.xkb.shiftIndex;
    modifiers[2].bit = 1;
    modifiers[3].index = _glfw.wl.xkb.superIndex;
    modifiers[3].bit = 8;
    modifiers[4].index = _glfw.wl.xkb.capsLockIndex;
    modifiers[4].bit = 0x10;
    modifiers[5].index = _glfw.wl.xkb.numLockIndex;
    modifiers[5].bit = 0x20;
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      iVar1 = (*_glfw.wl.xkb.state_mod_index_is_active)
                        (_glfw.wl.xkb.state,modifiers[lVar2].index,XKB_STATE_MODS_EFFECTIVE);
      if (iVar1 == 1) {
        _glfw.wl.xkb.modifiers = _glfw.wl.xkb.modifiers | modifiers[lVar2].bit;
      }
    }
  }
  return;
}

Assistant:

static void keyboardHandleModifiers(void* userData,
                                    struct wl_keyboard* keyboard,
                                    uint32_t serial,
                                    uint32_t modsDepressed,
                                    uint32_t modsLatched,
                                    uint32_t modsLocked,
                                    uint32_t group)
{
    _glfw.wl.serial = serial;

    if (!_glfw.wl.xkb.keymap)
        return;

    xkb_state_update_mask(_glfw.wl.xkb.state,
                          modsDepressed,
                          modsLatched,
                          modsLocked,
                          0,
                          0,
                          group);

    _glfw.wl.xkb.modifiers = 0;

    struct
    {
        xkb_mod_index_t index;
        unsigned int bit;
    } modifiers[] =
    {
        { _glfw.wl.xkb.controlIndex,  GLFW_MOD_CONTROL },
        { _glfw.wl.xkb.altIndex,      GLFW_MOD_ALT },
        { _glfw.wl.xkb.shiftIndex,    GLFW_MOD_SHIFT },
        { _glfw.wl.xkb.superIndex,    GLFW_MOD_SUPER },
        { _glfw.wl.xkb.capsLockIndex, GLFW_MOD_CAPS_LOCK },
        { _glfw.wl.xkb.numLockIndex,  GLFW_MOD_NUM_LOCK }
    };

    for (size_t i = 0; i < sizeof(modifiers) / sizeof(modifiers[0]); i++)
    {
        if (xkb_state_mod_index_is_active(_glfw.wl.xkb.state,
                                          modifiers[i].index,
                                          XKB_STATE_MODS_EFFECTIVE) == 1)
        {
            _glfw.wl.xkb.modifiers |= modifiers[i].bit;
        }
    }
}